

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_retire_connection_id_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  uint8_t **in_RSI;
  long in_RDI;
  quicly_retire_connection_id_frame_t frame;
  int has_pending;
  int ret;
  quicly_retire_connection_id_frame_t *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = quicly_decode_retire_connection_id_frame
                    (in_RSI,(uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                     ,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    if (in_stack_ffffffffffffffd8 <
        (quicly_retire_connection_id_frame_t *)(ulong)(*(uint *)(in_RDI + 0x14) & 0xff)) {
      iVar1 = quicly_local_cid_retire
                        (_has_pending,frame.sequence,
                         (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        if (in_stack_ffffffffffffffe0 != 0) {
          *(byte *)(in_RDI + 0x7bc) = *(byte *)(in_RDI + 0x7bc) | 0x80;
        }
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 0x2000a;
    }
  }
  return iVar1;
}

Assistant:

static int handle_retire_connection_id_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret, has_pending;
    quicly_retire_connection_id_frame_t frame;

    if ((ret = quicly_decode_retire_connection_id_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(RETIRE_CONNECTION_ID_RECEIVE, conn, conn->stash.now, frame.sequence);

    if (frame.sequence >= conn->super.local.cid_set.plaintext.path_id) {
        /* Receipt of a RETIRE_CONNECTION_ID frame containing a sequence number greater than any previously sent to the remote peer
         * MUST be treated as a connection error of type PROTOCOL_VIOLATION. (19.16) */
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }

    if ((ret = quicly_local_cid_retire(&conn->super.local.cid_set, frame.sequence, &has_pending)) != 0)
        return ret;
    if (has_pending)
        conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;

    return 0;
}